

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_4fPoint * __thiscall ON_4fPoint::operator+=(ON_4fPoint *this,ON_4fPoint *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar15 = p->w;
  fVar16 = this->w;
  if (((fVar15 == fVar16) && (!NAN(fVar15) && !NAN(fVar16))) || ((fVar15 == 0.0 && (!NAN(fVar15)))))
  {
    uVar1 = p->x;
    uVar7 = p->y;
    uVar2 = this->x;
    uVar8 = this->y;
    this->x = (float)uVar2 + (float)uVar1;
    this->y = (float)uVar8 + (float)uVar7;
    this->z = p->z + this->z;
  }
  else if ((fVar16 != 0.0) || (NAN(fVar16))) {
    if (fVar16 <= 0.0) {
      if (-0.0 < fVar16) {
        fVar16 = sqrtf(-fVar16);
      }
      else {
        fVar16 = SQRT(-fVar16);
      }
      fVar16 = -fVar16;
    }
    else if (fVar16 < 0.0) {
      fVar16 = sqrtf(fVar16);
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    fVar15 = p->w;
    if (fVar15 <= 0.0) {
      if (-0.0 < fVar15) {
        fVar15 = sqrtf(-fVar15);
      }
      else {
        fVar15 = SQRT(-fVar15);
      }
      fVar15 = -fVar15;
    }
    else if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      fVar15 = SQRT(fVar15);
    }
    fVar14 = fVar15 / fVar16;
    uVar5 = this->x;
    uVar11 = this->y;
    fVar13 = fVar16 / fVar15;
    uVar6 = p->x;
    uVar12 = p->y;
    this->x = fVar14 * (float)uVar5 + fVar13 * (float)uVar6;
    this->y = fVar14 * (float)uVar11 + fVar13 * (float)uVar12;
    this->z = this->z * fVar14 + p->z * fVar13;
    this->w = fVar16 * fVar15;
  }
  else {
    uVar3 = p->x;
    uVar9 = p->y;
    uVar4 = this->x;
    uVar10 = this->y;
    this->x = (float)uVar4 + (float)uVar3;
    this->y = (float)uVar10 + (float)uVar9;
    this->z = p->z + this->z;
    this->w = fVar15;
  }
  return this;
}

Assistant:

ON_4fPoint& ON_4fPoint::operator+=(const ON_4fPoint& p)
{
  // sum w = sqrt(w1*w2)
  if ( p.w == w ) {
    x += p.x;
    y += p.y;
    z += p.z;
  }
  else if (p.w == 0.0 ) {
    x += p.x;
    y += p.y;
    z += p.z;
  }
  else if ( w == 0.0 ) {
    x += p.x;
    y += p.y;
    z += p.z;
    w = p.w;
  }
  else {
    const double sw1 = (w>0.0) ? sqrt(w) : -sqrt(-w);
    const double sw2 = (p.w>0.0) ? sqrt(p.w) : -sqrt(-p.w);
    const double s1 = sw2/sw1;
    const double s2 = sw1/sw2;
    x = (float)(x*s1 + p.x*s2);
    y = (float)(y*s1 + p.y*s2);
    z = (float)(z*s1 + p.z*s2);
    w = (float)(sw1*sw2);
  }
  return *this;
}